

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O0

sexp sexp_reverse_op(sexp ctx,sexp self,sexp_sint_t n,sexp ls)

{
  int *in_RCX;
  long in_RDI;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp res;
  sexp in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc0;
  bool bVar1;
  undefined1 *n_00;
  sexp self_00;
  sexp ctx_00;
  int *local_20;
  
  memset(&stack0xffffffffffffffc8,0,0x10);
  n_00 = &stack0xffffffffffffffd8;
  self_00 = *(sexp *)(in_RDI + 0x6080);
  *(undefined1 **)(in_RDI + 0x6080) = &stack0xffffffffffffffc8;
  ctx_00 = (sexp)&DAT_0000023e;
  local_20 = in_RCX;
  while( true ) {
    bVar1 = false;
    if (((ulong)local_20 & 3) == 0) {
      bVar1 = *local_20 == 6;
    }
    if (bVar1 == false) break;
    ctx_00 = sexp_cons_op(ctx_00,self_00,(sexp_sint_t)n_00,
                          (sexp)CONCAT17(bVar1,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8)
    ;
    local_20 = *(int **)(local_20 + 4);
  }
  *(sexp *)(in_RDI + 0x6080) = self_00;
  return ctx_00;
}

Assistant:

sexp sexp_reverse_op (sexp ctx, sexp self, sexp_sint_t n, sexp ls) {
  sexp_gc_var1(res);
  sexp_gc_preserve1(ctx, res);
  for (res=SEXP_NULL; sexp_pairp(ls); ls=sexp_cdr(ls))
    res = sexp_cons(ctx, sexp_car(ls), res);
  sexp_gc_release1(ctx);
  return res;
}